

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
               (CodedInputStream *input,int32 *value)

{
  bool bVar1;
  uint32 temp;
  uint32 local_c;
  
  bVar1 = io::CodedInputStream::ReadLittleEndian32(input,&local_c);
  if (bVar1) {
    *value = local_c;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32, WireFormatLite::TYPE_SFIXED32>(
    io::CodedInputStream* input,
    int32* value) {
  uint32 temp;
  if (!input->ReadLittleEndian32(&temp)) return false;
  *value = static_cast<int32>(temp);
  return true;
}